

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

Workitem * __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this)

{
  __pointer_type pWVar1;
  __pointer_type pWVar2;
  bool bVar3;
  
  pWVar1 = (this->head_)._M_b._M_p;
  do {
    while (pWVar2 = pWVar1, ((ulong)pWVar2 & 0xffffffffffff) == 0) {
      allocate(this);
      pWVar1 = (this->head_)._M_b._M_p;
    }
    LOCK();
    pWVar1 = (this->head_)._M_b._M_p;
    bVar3 = pWVar2 == pWVar1;
    if (bVar3) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)pWVar2 & 0xffff000000000000 | 0xffffffffffff) +
            (*(ulong *)(((ulong)pWVar2 & 0xffffffffffff) + 0x18) & 0xffffffffffff) + 1);
      pWVar1 = pWVar2;
    }
    UNLOCK();
  } while (!bVar3);
  return (Workitem *)((ulong)pWVar2 & 0xffffffffffff);
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }